

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sse2.c
# Opt level: O0

int GetResidualCost_SSE2(int ctx0,VP8Residual *res)

{
  uint8_t proba;
  long lVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  int iVar25;
  int *in_RSI;
  int in_EDI;
  ushort uVar26;
  ushort uVar27;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  undefined1 auVar28 [16];
  int last_p0;
  int ctx_1;
  int b;
  int flevel_1;
  int level_1;
  int flevel;
  int level;
  int ctx;
  __m128i H;
  __m128i G;
  __m128i F;
  __m128i E1;
  __m128i E0;
  __m128i D1;
  __m128i D0;
  __m128i c1;
  __m128i c0;
  __m128i kCst67;
  __m128i kCst2;
  __m128i zero;
  int cost;
  uint16_t *t;
  CostArrayPtr costs;
  int p0;
  int n;
  uint16_t abs_levels [16];
  uint8_t ctxs [16];
  uint8_t levels [16];
  int local_32c;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  int local_244;
  long local_240;
  int local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  int *local_1e8;
  int local_1dc;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_18a;
  undefined1 local_189;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 local_10;
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  undefined1 local_8;
  undefined1 local_7;
  undefined1 local_6;
  undefined1 local_5;
  undefined1 local_4;
  undefined1 local_3;
  undefined1 local_2;
  undefined1 local_1;
  
  local_22c = *in_RSI;
  proba = *(uint8_t *)(*(long *)(in_RSI + 6) + (long)local_22c * 0x21 + (long)in_EDI * 0xb);
  lVar1 = *(long *)(in_RSI + 10);
  local_240 = *(long *)(lVar1 + (long)local_22c * 0x18 + (long)in_EDI * 8);
  local_1e8 = in_RSI;
  if (in_EDI == 0) {
    local_32c = VP8BitCost(1,proba);
  }
  else {
    local_32c = 0;
  }
  local_244 = local_32c;
  if (local_1e8[1] < 0) {
    local_1dc = VP8BitCost(0,proba);
  }
  else {
    local_1c8 = 0;
    uStack_1c0 = 0;
    local_189 = 2;
    local_29 = 2;
    local_2a = 2;
    local_2b = 2;
    local_2c = 2;
    local_2d = 2;
    local_2e = 2;
    local_2f = 2;
    local_30 = 2;
    local_31 = 2;
    local_32 = 2;
    local_33 = 2;
    local_34 = 2;
    local_35 = 2;
    local_36 = 2;
    local_37 = 2;
    local_38 = 2;
    local_48 = 0x202020202020202;
    uStack_40 = 0x202020202020202;
    local_18a = 0x43;
    local_1 = 0x43;
    local_2 = 0x43;
    local_3 = 0x43;
    local_4 = 0x43;
    local_5 = 0x43;
    local_6 = 0x43;
    local_7 = 0x43;
    local_8 = 0x43;
    local_9 = 0x43;
    local_a = 0x43;
    local_b = 0x43;
    local_c = 0x43;
    local_d = 0x43;
    local_e = 0x43;
    local_f = 0x43;
    local_10 = 0x43;
    local_28 = 0x4343434343434343;
    uStack_20 = 0x4343434343434343;
    local_1d0 = *(undefined8 **)(local_1e8 + 2);
    local_118 = *local_1d0;
    uStack_110 = local_1d0[1];
    local_1d8 = (undefined8 *)(*(long *)(local_1e8 + 2) + 0x10);
    local_138 = *local_1d8;
    uStack_130 = *(undefined8 *)(*(long *)(local_1e8 + 2) + 0x18);
    local_158 = 0;
    uStack_150 = 0;
    local_168 = local_118;
    uVar21 = local_168;
    uStack_160 = uStack_110;
    uVar22 = uStack_160;
    local_168._0_2_ = (short)local_118;
    local_168._2_2_ = (short)((ulong)local_118 >> 0x10);
    local_168._4_2_ = (short)((ulong)local_118 >> 0x20);
    local_168._6_2_ = (short)((ulong)local_118 >> 0x30);
    uStack_160._0_2_ = (short)uStack_110;
    uStack_160._2_2_ = (short)((ulong)uStack_110 >> 0x10);
    uStack_160._4_2_ = (short)((ulong)uStack_110 >> 0x20);
    uStack_160._6_2_ = (short)((ulong)uStack_110 >> 0x30);
    sVar2 = -(short)local_168;
    sVar3 = -local_168._2_2_;
    sVar4 = -local_168._4_2_;
    sVar5 = -local_168._6_2_;
    sVar6 = -(short)uStack_160;
    sVar7 = -uStack_160._2_2_;
    sVar8 = -uStack_160._4_2_;
    sVar9 = -uStack_160._6_2_;
    local_178 = 0;
    uStack_170 = 0;
    local_188 = local_138;
    uVar19 = local_188;
    uStack_180 = uStack_130;
    uVar20 = uStack_180;
    local_188._0_2_ = (short)local_138;
    local_188._2_2_ = (short)((ulong)local_138 >> 0x10);
    local_188._4_2_ = (short)((ulong)local_138 >> 0x20);
    local_188._6_2_ = (short)((ulong)local_138 >> 0x30);
    uStack_180._0_2_ = (short)uStack_130;
    uStack_180._2_2_ = (short)((ulong)uStack_130 >> 0x10);
    uStack_180._4_2_ = (short)((ulong)uStack_130 >> 0x20);
    uStack_180._6_2_ = (short)((ulong)uStack_130 >> 0x30);
    sVar10 = -(short)local_188;
    sVar11 = -local_188._2_2_;
    sVar12 = -local_188._4_2_;
    sVar13 = -local_188._6_2_;
    sVar14 = -(short)uStack_180;
    sVar15 = -uStack_180._2_2_;
    sVar16 = -uStack_180._4_2_;
    sVar17 = -uStack_180._6_2_;
    local_128 = CONCAT26(sVar5,CONCAT24(sVar4,CONCAT22(sVar3,sVar2)));
    uStack_120 = CONCAT26(sVar9,CONCAT24(sVar8,CONCAT22(sVar7,sVar6)));
    uVar26 = (ushort)((short)local_168 < sVar2) * sVar2 |
             (ushort)((short)local_168 >= sVar2) * (short)local_168;
    uVar29 = (ushort)(local_168._2_2_ < sVar3) * sVar3 |
             (ushort)(local_168._2_2_ >= sVar3) * local_168._2_2_;
    uVar31 = (ushort)(local_168._4_2_ < sVar4) * sVar4 |
             (ushort)(local_168._4_2_ >= sVar4) * local_168._4_2_;
    uVar33 = (ushort)(local_168._6_2_ < sVar5) * sVar5 |
             (ushort)(local_168._6_2_ >= sVar5) * local_168._6_2_;
    uVar35 = (ushort)((short)uStack_160 < sVar6) * sVar6 |
             (ushort)((short)uStack_160 >= sVar6) * (short)uStack_160;
    uVar37 = (ushort)(uStack_160._2_2_ < sVar7) * sVar7 |
             (ushort)(uStack_160._2_2_ >= sVar7) * uStack_160._2_2_;
    uVar39 = (ushort)(uStack_160._4_2_ < sVar8) * sVar8 |
             (ushort)(uStack_160._4_2_ >= sVar8) * uStack_160._4_2_;
    uVar41 = (ushort)(uStack_160._6_2_ < sVar9) * sVar9 |
             (ushort)(uStack_160._6_2_ >= sVar9) * uStack_160._6_2_;
    local_148 = CONCAT26(sVar13,CONCAT24(sVar12,CONCAT22(sVar11,sVar10)));
    uStack_140 = CONCAT26(sVar17,CONCAT24(sVar16,CONCAT22(sVar15,sVar14)));
    uVar27 = (ushort)((short)local_188 < sVar10) * sVar10 |
             (ushort)((short)local_188 >= sVar10) * (short)local_188;
    uVar30 = (ushort)(local_188._2_2_ < sVar11) * sVar11 |
             (ushort)(local_188._2_2_ >= sVar11) * local_188._2_2_;
    uVar32 = (ushort)(local_188._4_2_ < sVar12) * sVar12 |
             (ushort)(local_188._4_2_ >= sVar12) * local_188._4_2_;
    uVar34 = (ushort)(local_188._6_2_ < sVar13) * sVar13 |
             (ushort)(local_188._6_2_ >= sVar13) * local_188._6_2_;
    uVar36 = (ushort)((short)uStack_180 < sVar14) * sVar14 |
             (ushort)((short)uStack_180 >= sVar14) * (short)uStack_180;
    uVar38 = (ushort)(uStack_180._2_2_ < sVar15) * sVar15 |
             (ushort)(uStack_180._2_2_ >= sVar15) * uStack_180._2_2_;
    uVar40 = (ushort)(uStack_180._4_2_ < sVar16) * sVar16 |
             (ushort)(uStack_180._4_2_ >= sVar16) * uStack_180._4_2_;
    uVar42 = (ushort)(uStack_180._6_2_ < sVar17) * sVar17 |
             (ushort)(uStack_180._6_2_ >= sVar17) * uStack_180._6_2_;
    local_1a8 = CONCAT26(uVar33,CONCAT24(uVar31,CONCAT22(uVar29,uVar26)));
    uStack_1a0 = CONCAT26(uVar41,CONCAT24(uVar39,CONCAT22(uVar37,uVar35)));
    local_1b8 = CONCAT26(uVar34,CONCAT24(uVar32,CONCAT22(uVar30,uVar27)));
    uStack_1b0 = CONCAT26(uVar42,CONCAT24(uVar40,CONCAT22(uVar38,uVar36)));
    auVar18._8_8_ = uStack_1a0;
    auVar18._0_8_ = local_1a8;
    auVar28._8_8_ = uStack_1b0;
    auVar28._0_8_ = local_1b8;
    auVar28 = packsswb(auVar18,auVar28);
    local_2e8 = auVar28._0_8_;
    uStack_2e0 = auVar28._8_8_;
    local_d8 = local_2e8;
    uVar23 = local_d8;
    uStack_d0 = uStack_2e0;
    uVar24 = uStack_d0;
    local_e8 = 0x202020202020202;
    uStack_e0 = 0x202020202020202;
    local_d8._0_1_ = auVar28[0];
    local_d8._1_1_ = auVar28[1];
    local_d8._2_1_ = auVar28[2];
    local_d8._3_1_ = auVar28[3];
    local_d8._4_1_ = auVar28[4];
    local_d8._5_1_ = auVar28[5];
    local_d8._6_1_ = auVar28[6];
    local_d8._7_1_ = auVar28[7];
    uStack_d0._0_1_ = auVar28[8];
    uStack_d0._1_1_ = auVar28[9];
    uStack_d0._2_1_ = auVar28[10];
    uStack_d0._3_1_ = auVar28[0xb];
    uStack_d0._4_1_ = auVar28[0xc];
    uStack_d0._5_1_ = auVar28[0xd];
    uStack_d0._6_1_ = auVar28[0xe];
    uStack_d0._7_1_ = auVar28[0xf];
    local_f8 = local_2e8;
    uStack_f0 = uStack_2e0;
    local_108 = 0x4343434343434343;
    uStack_100 = 0x4343434343434343;
    local_68 = CONCAT17((2 < local_d8._7_1_) * '\x02' | (2 >= local_d8._7_1_) * local_d8._7_1_,
                        CONCAT16((2 < local_d8._6_1_) * '\x02' |
                                 (2 >= local_d8._6_1_) * local_d8._6_1_,
                                 CONCAT15((2 < local_d8._5_1_) * '\x02' |
                                          (2 >= local_d8._5_1_) * local_d8._5_1_,
                                          CONCAT14((2 < local_d8._4_1_) * '\x02' |
                                                   (2 >= local_d8._4_1_) * local_d8._4_1_,
                                                   CONCAT13((2 < local_d8._3_1_) * '\x02' |
                                                            (2 >= local_d8._3_1_) * local_d8._3_1_,
                                                            CONCAT12((2 < local_d8._2_1_) * '\x02' |
                                                                     (2 >= local_d8._2_1_) *
                                                                     local_d8._2_1_,
                                                                     CONCAT11((2 < local_d8._1_1_) *
                                                                              '\x02' | (2 >= 
                                                  local_d8._1_1_) * local_d8._1_1_,
                                                  (2 < (byte)local_d8) * '\x02' |
                                                  (2 >= (byte)local_d8) * (byte)local_d8)))))));
    uStack_60 = CONCAT17((2 < uStack_d0._7_1_) * '\x02' | (2 >= uStack_d0._7_1_) * uStack_d0._7_1_,
                         CONCAT16((2 < uStack_d0._6_1_) * '\x02' |
                                  (2 >= uStack_d0._6_1_) * uStack_d0._6_1_,
                                  CONCAT15((2 < uStack_d0._5_1_) * '\x02' |
                                           (2 >= uStack_d0._5_1_) * uStack_d0._5_1_,
                                           CONCAT14((2 < uStack_d0._4_1_) * '\x02' |
                                                    (2 >= uStack_d0._4_1_) * uStack_d0._4_1_,
                                                    CONCAT13((2 < uStack_d0._3_1_) * '\x02' |
                                                             (2 >= uStack_d0._3_1_) *
                                                             uStack_d0._3_1_,
                                                             CONCAT12((2 < uStack_d0._2_1_) * '\x02'
                                                                      | (2 >= uStack_d0._2_1_) *
                                                                        uStack_d0._2_1_,
                                                                      CONCAT11((2 < uStack_d0._1_1_)
                                                                               * '\x02' |
                                                                               (2 >= uStack_d0._1_1_
                                                                               ) * uStack_d0._1_1_,
                                                                               (2 < (byte)uStack_d0)
                                                                               * '\x02' |
                                                                               (2 >= (byte)uStack_d0
                                                                               ) * (byte)uStack_d0))
                                                            )))));
    local_50 = &local_208;
    local_208 = local_68;
    uStack_200 = uStack_60;
    local_88 = CONCAT17((0x43 < local_d8._7_1_) * 'C' | (0x43 >= local_d8._7_1_) * local_d8._7_1_,
                        CONCAT16((0x43 < local_d8._6_1_) * 'C' |
                                 (0x43 >= local_d8._6_1_) * local_d8._6_1_,
                                 CONCAT15((0x43 < local_d8._5_1_) * 'C' |
                                          (0x43 >= local_d8._5_1_) * local_d8._5_1_,
                                          CONCAT14((0x43 < local_d8._4_1_) * 'C' |
                                                   (0x43 >= local_d8._4_1_) * local_d8._4_1_,
                                                   CONCAT13((0x43 < local_d8._3_1_) * 'C' |
                                                            (0x43 >= local_d8._3_1_) *
                                                            local_d8._3_1_,
                                                            CONCAT12((0x43 < local_d8._2_1_) * 'C' |
                                                                     (0x43 >= local_d8._2_1_) *
                                                                     local_d8._2_1_,
                                                                     CONCAT11((0x43 < local_d8._1_1_
                                                                              ) * 'C' | (0x43 >= 
                                                  local_d8._1_1_) * local_d8._1_1_,
                                                  (0x43 < (byte)local_d8) * 'C' |
                                                  (0x43 >= (byte)local_d8) * (byte)local_d8)))))));
    uStack_80 = CONCAT17((0x43 < uStack_d0._7_1_) * 'C' |
                         (0x43 >= uStack_d0._7_1_) * uStack_d0._7_1_,
                         CONCAT16((0x43 < uStack_d0._6_1_) * 'C' |
                                  (0x43 >= uStack_d0._6_1_) * uStack_d0._6_1_,
                                  CONCAT15((0x43 < uStack_d0._5_1_) * 'C' |
                                           (0x43 >= uStack_d0._5_1_) * uStack_d0._5_1_,
                                           CONCAT14((0x43 < uStack_d0._4_1_) * 'C' |
                                                    (0x43 >= uStack_d0._4_1_) * uStack_d0._4_1_,
                                                    CONCAT13((0x43 < uStack_d0._3_1_) * 'C' |
                                                             (0x43 >= uStack_d0._3_1_) *
                                                             uStack_d0._3_1_,
                                                             CONCAT12((0x43 < uStack_d0._2_1_) * 'C'
                                                                      | (0x43 >= uStack_d0._2_1_) *
                                                                        uStack_d0._2_1_,
                                                                      CONCAT11((0x43 < uStack_d0.
                                                                                       _1_1_) * 'C'
                                                                               | (0x43 >= uStack_d0.
                                                                                          _1_1_) *
                                                                                 uStack_d0._1_1_,
                                                                               (0x43 < (byte)
                                                  uStack_d0) * 'C' |
                                                  (0x43 >= (byte)uStack_d0) * (byte)uStack_d0)))))))
    ;
    local_70 = &local_1f8;
    local_1f8 = local_88;
    uStack_1f0 = uStack_80;
    local_a8 = CONCAT26(uVar33,CONCAT24(uVar31,CONCAT22(uVar29,uVar26)));
    uStack_a0 = CONCAT26(uVar41,CONCAT24(uVar39,CONCAT22(uVar37,uVar35)));
    local_90 = &local_228;
    local_228 = local_a8;
    uStack_220 = uStack_a0;
    local_c8 = CONCAT26(uVar34,CONCAT24(uVar32,CONCAT22(uVar30,uVar27)));
    uStack_c0 = CONCAT26(uVar42,CONCAT24(uVar40,CONCAT22(uVar38,uVar36)));
    local_b0 = &local_218;
    local_218 = local_c8;
    uStack_210 = uStack_c0;
    for (; local_22c < local_1e8[1]; local_22c = local_22c + 1) {
      local_244 = (uint)VP8LevelFixedCosts
                        [(int)(uint)*(ushort *)((long)&local_228 + (long)local_22c * 2)] +
                  (uint)*(ushort *)
                         (local_240 +
                         (long)(int)(uint)*(byte *)((long)&local_1f8 + (long)local_22c) * 2) +
                  local_244;
      local_240 = *(long *)(lVar1 + (long)(local_22c + 1) * 0x18 +
                           (long)(int)(uint)*(byte *)((long)&local_208 + (long)local_22c) * 8);
    }
    local_244 = (uint)VP8LevelFixedCosts
                      [(int)(uint)*(ushort *)((long)&local_228 + (long)local_22c * 2)] +
                (uint)*(ushort *)
                       (local_240 +
                       (long)(int)(uint)*(byte *)((long)&local_1f8 + (long)local_22c) * 2) +
                local_244;
    if (local_22c < 0xf) {
      local_188 = uVar19;
      uStack_180 = uVar20;
      local_168 = uVar21;
      uStack_160 = uVar22;
      local_d8 = uVar23;
      uStack_d0 = uVar24;
      iVar25 = VP8BitCost(0,*(uint8_t *)
                             (*(long *)(local_1e8 + 6) + (long)(int)(uint)""[local_22c + 1] * 0x21 +
                             (long)(int)(uint)*(byte *)((long)&local_208 + (long)local_22c) * 0xb));
      local_244 = iVar25 + local_244;
    }
    local_1dc = local_244;
  }
  return local_1dc;
}

Assistant:

static int GetResidualCost_SSE2(int ctx0, const VP8Residual* const res) {
  uint8_t levels[16], ctxs[16];
  uint16_t abs_levels[16];
  int n = res->first;
  // should be prob[VP8EncBands[n]], but it's equivalent for n=0 or 1
  const int p0 = res->prob[n][ctx0][0];
  CostArrayPtr const costs = res->costs;
  const uint16_t* t = costs[n][ctx0];
  // bit_cost(1, p0) is already incorporated in t[] tables, but only if ctx != 0
  // (as required by the syntax). For ctx0 == 0, we need to add it here or it'll
  // be missing during the loop.
  int cost = (ctx0 == 0) ? VP8BitCost(1, p0) : 0;

  if (res->last < 0) {
    return VP8BitCost(0, p0);
  }

  {   // precompute clamped levels and contexts, packed to 8b.
    const __m128i zero = _mm_setzero_si128();
    const __m128i kCst2 = _mm_set1_epi8(2);
    const __m128i kCst67 = _mm_set1_epi8(MAX_VARIABLE_LEVEL);
    const __m128i c0 = _mm_loadu_si128((const __m128i*)&res->coeffs[0]);
    const __m128i c1 = _mm_loadu_si128((const __m128i*)&res->coeffs[8]);
    const __m128i D0 = _mm_sub_epi16(zero, c0);
    const __m128i D1 = _mm_sub_epi16(zero, c1);
    const __m128i E0 = _mm_max_epi16(c0, D0);   // abs(v), 16b
    const __m128i E1 = _mm_max_epi16(c1, D1);
    const __m128i F = _mm_packs_epi16(E0, E1);
    const __m128i G = _mm_min_epu8(F, kCst2);    // context = 0,1,2
    const __m128i H = _mm_min_epu8(F, kCst67);   // clamp_level in [0..67]

    _mm_storeu_si128((__m128i*)&ctxs[0], G);
    _mm_storeu_si128((__m128i*)&levels[0], H);

    _mm_storeu_si128((__m128i*)&abs_levels[0], E0);
    _mm_storeu_si128((__m128i*)&abs_levels[8], E1);
  }
  for (; n < res->last; ++n) {
    const int ctx = ctxs[n];
    const int level = levels[n];
    const int flevel = abs_levels[n];   // full level
    cost += VP8LevelFixedCosts[flevel] + t[level];  // simplified VP8LevelCost()
    t = costs[n + 1][ctx];
  }
  // Last coefficient is always non-zero
  {
    const int level = levels[n];
    const int flevel = abs_levels[n];
    assert(flevel != 0);
    cost += VP8LevelFixedCosts[flevel] + t[level];
    if (n < 15) {
      const int b = VP8EncBands[n + 1];
      const int ctx = ctxs[n];
      const int last_p0 = res->prob[b][ctx][0];
      cost += VP8BitCost(0, last_p0);
    }
  }
  return cost;
}